

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_suite.cpp
# Opt level: O1

void to_suite::convert_integer(void)

{
  char *pcVar1;
  long *plVar2;
  char cVar3;
  uchar uVar4;
  short sVar5;
  unsigned_short uVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined *puVar9;
  bool bVar10;
  any result;
  integer_type input;
  variable data;
  any local_60;
  any local_58;
  unsigned_long local_50;
  type local_48;
  undefined1 local_28;
  
  local_58.content._0_1_ = (convert)0x2;
  local_28 = 2;
  local_48.__data[0] = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&local_60,(basic_variable<std::allocator<char>_> *)&local_48.__align);
  if (local_60.content == (placeholder *)0x0) {
    puVar9 = &void::typeinfo;
  }
  else {
    iVar7 = (*(local_60.content)->_vptr_placeholder[2])();
    puVar9 = (undefined *)CONCAT44(extraout_var,iVar7);
  }
  pcVar1 = *(char **)(puVar9 + 8);
  if (pcVar1 == _what) {
    bVar10 = true;
  }
  else if (*pcVar1 == '*') {
    bVar10 = false;
  }
  else {
    iVar7 = strcmp(pcVar1,_what);
    bVar10 = iVar7 == 0;
  }
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x177,"void to_suite::convert_integer()",bVar10);
  cVar3 = boost::any_cast<signed_char>(&local_60);
  local_50 = CONCAT71(local_50._1_7_,cVar3);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,signed_char,signed_char>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x178,"void to_suite::convert_integer()",&local_50,&local_58);
  if (local_60.content != (placeholder *)0x0) {
    (*(local_60.content)->_vptr_placeholder[1])();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48.__align);
  local_58.content._0_1_ = (convert)0x2;
  local_28 = 3;
  local_48.__data[0] = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&local_60,(basic_variable<std::allocator<char>_> *)&local_48.__align);
  if (local_60.content == (placeholder *)0x0) {
    puVar9 = &void::typeinfo;
  }
  else {
    iVar7 = (*(local_60.content)->_vptr_placeholder[2])();
    puVar9 = (undefined *)CONCAT44(extraout_var_00,iVar7);
  }
  pcVar1 = *(char **)(puVar9 + 8);
  if (pcVar1 == _terminate) {
    bVar10 = true;
  }
  else if (*pcVar1 == '*') {
    bVar10 = false;
  }
  else {
    iVar7 = strcmp(pcVar1,_terminate);
    bVar10 = iVar7 == 0;
  }
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x17f,"void to_suite::convert_integer()",bVar10);
  uVar4 = boost::any_cast<unsigned_char>(&local_60);
  local_50 = CONCAT71(local_50._1_7_,uVar4);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,unsigned_char>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x180,"void to_suite::convert_integer()",&local_50,&local_58);
  if (local_60.content != (placeholder *)0x0) {
    (*(local_60.content)->_vptr_placeholder[1])();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48.__align);
  local_58.content._0_1_ = (convert)0x2;
  local_58.content._1_1_ = 0;
  local_28 = 4;
  local_48._0_2_ = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&local_60,(basic_variable<std::allocator<char>_> *)&local_48.__align);
  if (local_60.content == (placeholder *)0x0) {
    puVar9 = &void::typeinfo;
  }
  else {
    iVar7 = (*(local_60.content)->_vptr_placeholder[2])();
    puVar9 = (undefined *)CONCAT44(extraout_var_01,iVar7);
  }
  pcVar1 = *(char **)(puVar9 + 8);
  if (pcVar1 == __M_insert<long>) {
    bVar10 = true;
  }
  else if (*pcVar1 == '*') {
    bVar10 = false;
  }
  else {
    iVar7 = strcmp(pcVar1,__M_insert<long>);
    bVar10 = iVar7 == 0;
  }
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x187,"void to_suite::convert_integer()",bVar10);
  sVar5 = boost::any_cast<short>(&local_60);
  local_50 = CONCAT62(local_50._2_6_,sVar5);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,short>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x188,"void to_suite::convert_integer()",&local_50,&local_58);
  if (local_60.content != (placeholder *)0x0) {
    (*(local_60.content)->_vptr_placeholder[1])();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48.__align);
  local_58.content._0_1_ = (convert)0x2;
  local_58.content._1_1_ = 0;
  local_28 = 5;
  local_48._0_2_ = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&local_60,(basic_variable<std::allocator<char>_> *)&local_48.__align);
  if (local_60.content == (placeholder *)0x0) {
    puVar9 = &void::typeinfo;
  }
  else {
    iVar7 = (*(local_60.content)->_vptr_placeholder[2])();
    puVar9 = (undefined *)CONCAT44(extraout_var_02,iVar7);
  }
  pcVar1 = *(char **)(puVar9 + 8);
  if (pcVar1 == _endl<char,std::char_traits<char>>) {
    bVar10 = true;
  }
  else if (*pcVar1 == '*') {
    bVar10 = false;
  }
  else {
    iVar7 = strcmp(pcVar1,_endl<char,std::char_traits<char>>);
    bVar10 = iVar7 == 0;
  }
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,399,"void to_suite::convert_integer()",bVar10);
  uVar6 = boost::any_cast<unsigned_short>(&local_60);
  local_50 = CONCAT62(local_50._2_6_,uVar6);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_short,unsigned_short>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,400,"void to_suite::convert_integer()",&local_50,&local_58);
  if (local_60.content != (placeholder *)0x0) {
    (*(local_60.content)->_vptr_placeholder[1])();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48.__align);
  local_58.content._0_1_ = (convert)0x2;
  local_58.content._1_1_ = 0;
  local_58.content._2_2_ = 0;
  local_28 = 6;
  local_48._0_4_ = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&local_60,(basic_variable<std::allocator<char>_> *)&local_48.__align);
  if (local_60.content == (placeholder *)0x0) {
    puVar9 = &void::typeinfo;
  }
  else {
    iVar7 = (*(local_60.content)->_vptr_placeholder[2])();
    puVar9 = (undefined *)CONCAT44(extraout_var_03,iVar7);
  }
  pcVar1 = *(char **)(puVar9 + 8);
  if (pcVar1 == _put) {
    bVar10 = true;
  }
  else if (*pcVar1 == '*') {
    bVar10 = false;
  }
  else {
    iVar7 = strcmp(pcVar1,_put);
    bVar10 = iVar7 == 0;
  }
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x197,"void to_suite::convert_integer()",bVar10);
  iVar7 = boost::any_cast<int>(&local_60);
  local_50 = CONCAT44(local_50._4_4_,iVar7);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x198,"void to_suite::convert_integer()",&local_50,&local_58);
  if (local_60.content != (placeholder *)0x0) {
    (*(local_60.content)->_vptr_placeholder[1])();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48.__align);
  local_58.content._0_1_ = (convert)0x2;
  local_58.content._1_1_ = 0;
  local_58.content._2_2_ = 0;
  local_28 = 7;
  local_48._0_4_ = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&local_60,(basic_variable<std::allocator<char>_> *)&local_48.__align);
  if (local_60.content == (placeholder *)0x0) {
    puVar9 = &void::typeinfo;
  }
  else {
    iVar7 = (*(local_60.content)->_vptr_placeholder[2])();
    puVar9 = (undefined *)CONCAT44(extraout_var_04,iVar7);
  }
  pcVar1 = *(char **)(puVar9 + 8);
  if (pcVar1 == ___cxa_end_catch) {
    bVar10 = true;
  }
  else if (*pcVar1 == '*') {
    bVar10 = false;
  }
  else {
    iVar7 = strcmp(pcVar1,___cxa_end_catch);
    bVar10 = iVar7 == 0;
  }
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x19f,"void to_suite::convert_integer()",bVar10);
  uVar8 = boost::any_cast<unsigned_int>(&local_60);
  local_50 = CONCAT44(local_50._4_4_,uVar8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,unsigned_int>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1a0,"void to_suite::convert_integer()",&local_50,&local_58);
  if (local_60.content != (placeholder *)0x0) {
    (*(local_60.content)->_vptr_placeholder[1])();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48.__align);
  local_60.content = (placeholder *)0x2;
  local_28 = 8;
  local_48._0_8_ = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&local_58,(basic_variable<std::allocator<char>_> *)&local_48.__align);
  plVar2 = (long *)CONCAT44(local_58.content._4_4_,
                            CONCAT22(local_58.content._2_2_,
                                     CONCAT11(local_58.content._1_1_,local_58.content._0_1_)));
  if (plVar2 == (long *)0x0) {
    puVar9 = &void::typeinfo;
  }
  else {
    puVar9 = (undefined *)(**(code **)(*plVar2 + 0x10))();
  }
  pcVar1 = *(char **)(puVar9 + 8);
  if (pcVar1 == _typeinfo) {
    bVar10 = true;
  }
  else if (*pcVar1 == '*') {
    bVar10 = false;
  }
  else {
    iVar7 = strcmp(pcVar1,_typeinfo);
    bVar10 = iVar7 == 0;
  }
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1a7,"void to_suite::convert_integer()",bVar10);
  local_50 = boost::any_cast<long>(&local_58);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1a8,"void to_suite::convert_integer()",&local_50,&local_60);
  plVar2 = (long *)CONCAT44(local_58.content._4_4_,
                            CONCAT22(local_58.content._2_2_,
                                     CONCAT11(local_58.content._1_1_,local_58.content._0_1_)));
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48.__align);
  local_60.content = (placeholder *)0x2;
  local_28 = 9;
  local_48._0_8_ = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&local_58,(basic_variable<std::allocator<char>_> *)&local_48.__align);
  plVar2 = (long *)CONCAT44(local_58.content._4_4_,
                            CONCAT22(local_58.content._2_2_,
                                     CONCAT11(local_58.content._1_1_,local_58.content._0_1_)));
  if (plVar2 == (long *)0x0) {
    puVar9 = &void::typeinfo;
  }
  else {
    puVar9 = (undefined *)(**(code **)(*plVar2 + 0x10))();
  }
  pcVar1 = *(char **)(puVar9 + 8);
  if (pcVar1 == _vtable) {
    bVar10 = true;
  }
  else if (*pcVar1 == '*') {
    bVar10 = false;
  }
  else {
    iVar7 = strcmp(pcVar1,_vtable);
    bVar10 = iVar7 == 0;
  }
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1af,"void to_suite::convert_integer()",bVar10);
  local_50 = boost::any_cast<unsigned_long>(&local_58);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,unsigned_long>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1b0,"void to_suite::convert_integer()",&local_50,&local_60);
  plVar2 = (long *)CONCAT44(local_58.content._4_4_,
                            CONCAT22(local_58.content._2_2_,
                                     CONCAT11(local_58.content._1_1_,local_58.content._0_1_)));
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48.__align);
  local_60.content = (placeholder *)0x2;
  local_28 = 10;
  local_48._0_8_ = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&local_58,(basic_variable<std::allocator<char>_> *)&local_48.__align);
  plVar2 = (long *)CONCAT44(local_58.content._4_4_,
                            CONCAT22(local_58.content._2_2_,
                                     CONCAT11(local_58.content._1_1_,local_58.content._0_1_)));
  if (plVar2 == (long *)0x0) {
    puVar9 = &void::typeinfo;
  }
  else {
    puVar9 = (undefined *)(**(code **)(*plVar2 + 0x10))();
  }
  pcVar1 = *(char **)(puVar9 + 8);
  if (pcVar1 == __Rb_tree_insert_and_rebalance) {
    bVar10 = true;
  }
  else if (*pcVar1 == '*') {
    bVar10 = false;
  }
  else {
    iVar7 = strcmp(pcVar1,__Rb_tree_insert_and_rebalance);
    bVar10 = iVar7 == 0;
  }
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1b7,"void to_suite::convert_integer()",bVar10);
  local_50 = boost::any_cast<long_long>(&local_58);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_long,long_long>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1b8,"void to_suite::convert_integer()",&local_50,&local_60);
  plVar2 = (long *)CONCAT44(local_58.content._4_4_,
                            CONCAT22(local_58.content._2_2_,
                                     CONCAT11(local_58.content._1_1_,local_58.content._0_1_)));
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48.__align);
  local_60.content = (placeholder *)0x2;
  local_28 = 0xb;
  local_48._0_8_ = 2;
  trial::dynamic::convert::into<boost::any,trial::dynamic::basic_variable<std::allocator<char>>>
            ((convert *)&local_58,(basic_variable<std::allocator<char>_> *)&local_48.__align);
  plVar2 = (long *)CONCAT44(local_58.content._4_4_,
                            CONCAT22(local_58.content._2_2_,
                                     CONCAT11(local_58.content._1_1_,local_58.content._0_1_)));
  if (plVar2 == (long *)0x0) {
    puVar9 = &void::typeinfo;
  }
  else {
    puVar9 = (undefined *)(**(code **)(*plVar2 + 0x10))();
  }
  pcVar1 = *(char **)(puVar9 + 8);
  if (pcVar1 == _operator_new) {
    bVar10 = true;
  }
  else if (*pcVar1 == '*') {
    bVar10 = false;
  }
  else {
    iVar7 = strcmp(pcVar1,_operator_new);
    bVar10 = iVar7 == 0;
  }
  boost::detail::test_impl
            ("result.type() == typeid(integer_type)",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1bf,"void to_suite::convert_integer()",bVar10);
  local_50 = boost::any_cast<unsigned_long_long>(&local_58);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long_long,unsigned_long_long>
            ("boost::any_cast<integer_type>(result)","input",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/convert/boost/any_suite.cpp"
             ,0x1c0,"void to_suite::convert_integer()",&local_50,&local_60);
  plVar2 = (long *)CONCAT44(local_58.content._4_4_,
                            CONCAT22(local_58.content._2_2_,
                                     CONCAT11(local_58.content._1_1_,local_58.content._0_1_)));
  if (plVar2 != (long *)0x0) {
    (**(code **)(*plVar2 + 8))();
  }
  trial::dynamic::detail::
  small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
  ::
  call<trial::dynamic::detail::small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>::destructor,void>
            ((small_union<std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>,max_align_t,unsigned_char,trial::dynamic::nullable,bool,signed_char,unsigned_char,short,unsigned_short,int,unsigned_int,long,unsigned_long,long_long,unsigned_long_long,float,double,long_double,std::__cxx11::string,std::__cxx11::wstring,std::__cxx11::u16string,std::__cxx11::u32string,std::vector<trial::dynamic::basic_variable<std::allocator<char>>,std::allocator<trial::dynamic::basic_variable<std::allocator<char>>>>,std::map<trial::dynamic::basic_variable<std::allocator<char>>,trial::dynamic::basic_variable<std::allocator<char>>,std::less<trial::dynamic::basic_variable<std::allocator<char>>>,std::allocator<std::pair<trial::dynamic::basic_variable<std::allocator<char>>const,trial::dynamic::basic_variable<std::allocator<char>>>>>>
              *)&local_48.__align);
  return;
}

Assistant:

void convert_integer()
{
    {
        using integer_type = signed char;
        integer_type input = 2;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = unsigned char;
        integer_type input = 2U;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = signed short int;
        integer_type input = 2;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = unsigned short int;
        integer_type input = 2U;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = signed int;
        integer_type input = 2;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = unsigned int;
        integer_type input = 2U;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = signed long int;
        integer_type input = 2L;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = unsigned long int;
        integer_type input = 2UL;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = signed long long int;
        integer_type input = 2LL;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
    {
        using integer_type = unsigned long long int;
        integer_type input = 2ULL;
        variable data(input);
        auto result = convert::into<boost::any>(data);
        TRIAL_PROTOCOL_TEST(result.type() == typeid(integer_type));
        TRIAL_PROTOCOL_TEST_EQUAL(boost::any_cast<integer_type>(result), input);
    }
}